

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O0

size_t __thiscall osc::OutboundPacketStream::Size(OutboundPacketStream *this)

{
  bool bVar1;
  size_t sVar2;
  size_t local_18;
  size_t result;
  OutboundPacketStream *this_local;
  
  local_18 = (long)this->argumentCurrent_ - (long)this->data_;
  bVar1 = IsMessageInProgress(this);
  if (bVar1) {
    sVar2 = RoundUp4((size_t)(this->end_ + (2 - (long)this->typeTagsCurrent_)));
    local_18 = sVar2 + local_18;
  }
  return local_18;
}

Assistant:

std::size_t OutboundPacketStream::Size() const
{
    std::size_t result = argumentCurrent_ - data_;
    if( IsMessageInProgress() ){
        // account for the length of the type tag string. the total type tag
        // includes an initial comma, plus at least one terminating \0
        result += RoundUp4( (end_ - typeTagsCurrent_) + 2 );
    }

    return result;
}